

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O3

double normal_truncated_ab_cdf(double x,double mu,double s,double a,double b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar1 = normal_01_cdf((a - mu) / s);
  dVar2 = normal_01_cdf((b - mu) / s);
  dVar3 = normal_01_cdf((x - mu) / s);
  return (dVar3 - dVar1) / (dVar2 - dVar1);
}

Assistant:

double normal_truncated_ab_cdf ( double x, double mu, double s, double a, 
  double b )

//****************************************************************************80
//
//  Purpose:
//
//    NORMAL_TRUNCATED_AB_CDF evaluates the truncated Normal CDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 August 2013
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the CDF.
//
//    Input, double MU, S, the mean and standard deviation of the
//    parent Normal distribution.
//
//    Input, double A, B, the lower and upper truncation limits.
//
//    Output, double NORMAL_TRUNCATED_AB_CDF, the value of the CDF.
//
{
  double alpha;
  double alpha_cdf;
  double beta;
  double beta_cdf;
  double cdf;
  double xi;
  double xi_cdf;

  alpha = ( a - mu ) / s;
  beta = ( b - mu ) / s;
  xi = ( x - mu ) / s;

  alpha_cdf = normal_01_cdf ( alpha );
  beta_cdf = normal_01_cdf ( beta );
  xi_cdf = normal_01_cdf ( xi );

  cdf = ( xi_cdf - alpha_cdf ) / ( beta_cdf - alpha_cdf );

  return cdf;
}